

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O0

const_reference __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::at
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos)

{
  size_type sVar1;
  out_of_range *this_00;
  const_reference pcVar2;
  out_of_range local_28 [16];
  size_type local_18;
  size_type pos_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  
  local_18 = pos;
  pos_local = (size_type)this;
  sVar1 = size(this);
  if (sVar1 <= pos) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(local_28,"nonstd::string_view::at()");
    std::out_of_range::out_of_range(this_00,local_28);
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pcVar2 = data_at(this,local_18);
  return pcVar2;
}

Assistant:

at( size_type pos ) const
    {
#if nssv_CONFIG_NO_EXCEPTIONS
        assert( pos < size() );
#else
        if ( pos >= size() )
        {
            throw std::out_of_range("nonstd::string_view::at()");
        }
#endif
        return data_at( pos );
    }